

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

void Url_Decode_UTF8(string *source)

{
  pointer pcVar1;
  size_type sVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  char *__s;
  uint uVar6;
  ulong uVar7;
  char local_418 [8];
  char tp [1000];
  
  __s = local_418;
  memset(__s,0,1000);
  pcVar1 = (source->_M_dataplus)._M_p;
  sVar2 = source->_M_string_length;
  for (uVar6 = 0; uVar7 = (ulong)uVar6, sVar2 != uVar7; uVar6 = uVar6 + iVar5) {
    cVar4 = pcVar1[uVar7];
    iVar5 = 1;
    if (cVar4 == '%') {
      cVar4 = '\t';
      if (pcVar1[uVar7 + 1] < 'A') {
        cVar4 = '\0';
      }
      cVar3 = -0x37;
      if (pcVar1[uVar7 + 2] < 'A') {
        cVar3 = -0x30;
      }
      cVar4 = cVar3 + pcVar1[uVar7 + 2] + (cVar4 + pcVar1[uVar7 + 1]) * '\x10';
      iVar5 = 3;
    }
    *__s = cVar4;
    __s = __s + 1;
  }
  std::__cxx11::string::assign((char *)source);
  return;
}

Assistant:

void Url_Decode_UTF8(std::string &source)
{
  char tp[1000];
  int i,pos=0;
  memset(tp,0,1000);
  const char * point=source.c_str();
  for (i=0;source.size()-i;)
  {
    if (point[i]=='%')
    {
      unsigned char k=trans2bit(point[i+1])*16+trans2bit(point[i+2]);
      tp[pos++]=k;
      i+=3;
    }
    else 
     tp[pos++]= point[i++];
  }
  source=tp;
  //printf("Url_Decode_UTF8 : %s\n",source.c_str());
}